

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O2

void __thiscall FWadFile::FindStrifeTeaserVoices(FWadFile *this)

{
  DWORD DVar1;
  FWadFileLump *pFVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  DVar1 = (this->super_FResourceFile).NumLumps;
  pFVar2 = this->Lumps;
  pcVar4 = (pFVar2->super_FResourceLump).field_3.Name + 3;
  uVar5 = 0;
  do {
    if (uVar5 == DVar1 + 1) {
      return;
    }
    if (((pFVar2[uVar5].super_FResourceLump.field_3.Name[0] == 'V') &&
        (pFVar2[uVar5].super_FResourceLump.field_3.Name[1] == 'O')) &&
       (lVar6 = -5, pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'C')) {
      do {
        if (lVar6 == 0) {
          pFVar2[uVar5].super_FResourceLump.Namespace = 9;
          break;
        }
        lVar3 = lVar6 + 5;
        lVar6 = lVar6 + 1;
      } while ((int)pcVar4[lVar3] - 0x30U < 10 || pcVar4[lVar3] == '\0');
    }
    uVar5 = uVar5 + 1;
    pcVar4 = pcVar4 + 0x58;
  } while( true );
}

Assistant:

void FWadFile::FindStrifeTeaserVoices ()
{
	for (DWORD i = 0; i <= NumLumps; ++i)
	{
		if (Lumps[i].Name[0] == 'V' &&
			Lumps[i].Name[1] == 'O' &&
			Lumps[i].Name[2] == 'C')
		{
			int j;

			for (j = 3; j < 8; ++j)
			{
				if (Lumps[i].Name[j] != 0 && !isdigit(Lumps[i].Name[j]))
					break;
			}
			if (j == 8)
			{
				Lumps[i].Namespace = ns_strifevoices;
			}
		}
	}
}